

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::CodeGeneratorRequest::MergePartialFromCodedStream
          (CodeGeneratorRequest *this,CodedInputStream *input)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  uint8 *puVar4;
  Rep *pRVar5;
  Arena *this_01;
  char *data;
  bool bVar6;
  short extraout_AX;
  uint32 uVar7;
  uint uVar8;
  Type *this_02;
  Version *this_03;
  ulong extraout_RAX;
  pair<int,_int> pVar9;
  string *value;
  Type *pTVar10;
  UnknownFieldSet *unknown_fields;
  int byte_limit;
  char cVar11;
  uint tag;
  ulong uVar12;
  int iVar13;
  int local_64;
  
  this_00 = &this->file_to_generate_;
  do {
    pbVar2 = input->buffer_;
    uVar7 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar7 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_0023db73;
      input->buffer_ = pbVar2 + 1;
      uVar12 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_0023db73:
      uVar7 = io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar12 = 0;
      if (uVar7 - 1 < 0x7f) {
        uVar12 = 0x100000000;
      }
      uVar12 = uVar7 | uVar12;
    }
    tag = (uint)uVar12;
    if ((uVar12 & 0x100000000) == 0) goto LAB_0023db95;
    uVar8 = (uint)(uVar12 >> 3) & 0x1fffffff;
    cVar11 = (char)uVar12;
    if (uVar8 < 3) {
      if (uVar8 == 1) {
        if (cVar11 != '\n') goto LAB_0023db95;
        pRVar5 = (this->file_to_generate_).super_RepeatedPtrFieldBase.rep_;
        if (pRVar5 == (Rep *)0x0) {
LAB_0023dd7c:
          internal::RepeatedPtrFieldBase::Reserve
                    (&this_00->super_RepeatedPtrFieldBase,
                     (this->file_to_generate_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_0023dd8c:
          pRVar5 = (this->file_to_generate_).super_RepeatedPtrFieldBase.rep_;
          pRVar5->allocated_size = pRVar5->allocated_size + 1;
          this_01 = (this->file_to_generate_).super_RepeatedPtrFieldBase.arena_;
          if (this_01 == (Arena *)0x0) {
            value = (string *)operator_new(0x20);
            (value->_M_dataplus)._M_p = (pointer)&value->field_2;
            value->_M_string_length = 0;
            (value->field_2)._M_local_buf[0] = '\0';
          }
          else {
            value = (string *)
                    Arena::AllocateAligned
                              (this_01,(type_info *)&std::__cxx11::string::typeinfo,0x20);
            (value->_M_dataplus)._M_p = (pointer)&value->field_2;
            value->_M_string_length = 0;
            (value->field_2)._M_local_buf[0] = '\0';
            Arena::AddListNode(this_01,value,internal::arena_destruct_object<std::__cxx11::string>);
          }
          pRVar5 = (this->file_to_generate_).super_RepeatedPtrFieldBase.rep_;
          iVar13 = (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
          (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ = iVar13 + 1;
          pRVar5->elements[iVar13] = value;
        }
        else {
          iVar13 = (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
          if (pRVar5->allocated_size <= iVar13) {
            if (pRVar5->allocated_size ==
                (this->file_to_generate_).super_RepeatedPtrFieldBase.total_size_) goto LAB_0023dd7c;
            goto LAB_0023dd8c;
          }
          (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ = iVar13 + 1;
          value = (string *)pRVar5->elements[iVar13];
        }
        bVar6 = internal::WireFormatLite::ReadBytes(input,value);
        if (bVar6) {
          pTVar10 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                              (&this_00->super_RepeatedPtrFieldBase,
                               (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ +
                               -1);
          data = (pTVar10->_M_dataplus)._M_p;
          pTVar10 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                              (&this_00->super_RepeatedPtrFieldBase,
                               (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ +
                               -1);
          internal::WireFormatLite::VerifyUtf8String
                    (data,(int)pTVar10->_M_string_length,PARSE,
                     "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
          goto LAB_0023dbd5;
        }
      }
      else {
        if ((uVar8 == 2) && (MergePartialFromCodedStream(), extraout_AX != 0)) {
          iVar13 = 6;
          if (extraout_AX != 1) goto LAB_0023dbd5;
          goto LAB_0023dbd8;
        }
LAB_0023db95:
        iVar13 = 7;
        if ((tag & 7) == 4 || tag == 0) goto LAB_0023dbd8;
        pvVar3 = (this->_internal_metadata_).
                 super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 .ptr_;
        if (((ulong)pvVar3 & 1) == 0) {
          unknown_fields =
               internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
        }
        else {
          unknown_fields = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
        }
        bVar6 = internal::WireFormat::SkipField(input,tag,unknown_fields);
        if (bVar6) goto LAB_0023dbd5;
      }
      iVar13 = 6;
    }
    else if (uVar8 == 3) {
      if (cVar11 != '\x1a') goto LAB_0023db95;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      if (this->compiler_version_ == (Version *)0x0) {
        this_03 = (Version *)operator_new(0x30);
        Version::Version(this_03);
        this->compiler_version_ = this_03;
      }
      MergePartialFromCodedStream();
      iVar13 = local_64;
      if ((extraout_RAX & 1) == 0) goto LAB_0023dbd5;
    }
    else {
      if ((uVar8 != 0xf) || (cVar11 != 'z')) goto LAB_0023db95;
      this_02 = internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::TypeHandler>
                          (&(this->proto_file_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (byte_limit = (int)(char)*puVar4, -1 < (char)*puVar4)) {
        input->buffer_ = puVar4 + 1;
        bVar6 = true;
      }
      else {
        byte_limit = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar6 = -1 < byte_limit;
      }
      iVar13 = 6;
      if ((((!bVar6) ||
           (pVar9 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,byte_limit),
           (long)pVar9 < 0)) ||
          (bVar6 = FileDescriptorProto::MergePartialFromCodedStream(this_02,input), !bVar6)) ||
         (bVar6 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar9.first),
         !bVar6)) goto LAB_0023dbd8;
LAB_0023dbd5:
      iVar13 = 0;
    }
LAB_0023dbd8:
    if (iVar13 != 0) {
      return iVar13 != 6;
    }
  } while( true );
}

Assistant:

bool CodeGeneratorRequest::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.compiler.CodeGeneratorRequest)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated string file_to_generate = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_file_to_generate()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->file_to_generate(this->file_to_generate_size() - 1).data(),
            this->file_to_generate(this->file_to_generate_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string parameter = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_parameter()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->parameter().data(), this->parameter().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.compiler.CodeGeneratorRequest.parameter");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.compiler.Version compiler_version = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_compiler_version()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
      case 15: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(122u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_proto_file()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.compiler.CodeGeneratorRequest)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.compiler.CodeGeneratorRequest)
  return false;
#undef DO_
}